

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_0::TestThread::run(TestThread *this)

{
  deUint64 dVar1;
  size_type sVar2;
  reference ppTVar3;
  runtime_error *error;
  int contextNdx;
  TestThread *this_local;
  
  dVar1 = deGetMicroseconds();
  this->m_beginTimeUs = dVar1;
  error._0_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
            ::size(&this->m_contexts);
    if ((int)sVar2 <= (int)error) break;
    ppTVar3 = std::
              vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ::operator[](&this->m_contexts,(long)(int)error);
    TestContext::render(*ppTVar3);
    error._0_4_ = (int)error + 1;
  }
  this->m_isOk = true;
  dVar1 = deGetMicroseconds();
  this->m_endTimeUs = dVar1;
  return;
}

Assistant:

void TestThread::run (void)
{
	try
	{
		m_beginTimeUs = deGetMicroseconds();

		for (int contextNdx = 0; contextNdx < (int)m_contexts.size(); contextNdx++)
			m_contexts[contextNdx]->render();

		m_isOk		= true;
		m_endTimeUs = deGetMicroseconds();
	}
	catch (const std::runtime_error& error)
	{
		m_isOk			= false;
		m_errorString	= error.what();
	}
	catch (...)
	{
		m_isOk			= false;
		m_errorString	= "Got unknown exception";
	}
}